

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O2

void Fatal(unqlite *pDb,char *zMsg)

{
  char *zErr;
  int iLen;
  
  if (pDb == (unqlite *)0x0) {
    zErr = zMsg;
    if (zMsg == (char *)0x0) goto LAB_0010a95e;
  }
  else {
    iLen = 0;
    unqlite_config(pDb,3,&zErr,&iLen);
    if (iLen < 1) goto LAB_0010a95e;
  }
  puts(zErr);
LAB_0010a95e:
  unqlite_lib_shutdown();
  exit(0);
}

Assistant:

static void Fatal(unqlite *pDb,const char *zMsg)
{
	if( pDb ){
		const char *zErr;
		int iLen = 0; /* Stupid cc warning */

		/* Extract the database error log */
		unqlite_config(pDb,UNQLITE_CONFIG_ERR_LOG,&zErr,&iLen);
		if( iLen > 0 ){
			/* Output the DB error log */
			puts(zErr); /* Always null terminated */
		}
	}else{
		if( zMsg ){
			puts(zMsg);
		}
	}
	/* Manually shutdown the library */
	unqlite_lib_shutdown();
	/* Exit immediately */
	exit(0);
}